

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapi_curl.c
# Opt level: O0

HTTPAPI_RESULT HTTPAPI_Init(void)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  LOGGER_LOG l;
  HTTPAPI_RESULT result;
  
  if (nUsersOfHTTPAPI == 0) {
    iVar1 = curl_global_init(0);
    if (iVar1 == 0) {
      nUsersOfHTTPAPI = nUsersOfHTTPAPI + 1;
      l._4_4_ = HTTPAPI_OK;
    }
    else {
      l._4_4_ = HTTPAPI_INIT_FAILED;
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar3 = HTTPAPI_RESULTStrings(HTTPAPI_INIT_FAILED);
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/httpapi_curl.c"
                  ,"HTTPAPI_Init",0x52,1,"(result = %s%s (%d))","",pcVar3,0x10);
      }
    }
  }
  else {
    nUsersOfHTTPAPI = nUsersOfHTTPAPI + 1;
    l._4_4_ = HTTPAPI_OK;
  }
  return l._4_4_;
}

Assistant:

HTTPAPI_RESULT HTTPAPI_Init(void)
{
    HTTPAPI_RESULT result;
    if (nUsersOfHTTPAPI == 0)
    {
        if (curl_global_init(CURL_GLOBAL_NOTHING) != 0)
        {
            result = HTTPAPI_INIT_FAILED;
            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
        }
        else
        {
            nUsersOfHTTPAPI++;
            result = HTTPAPI_OK;
        }
    }
    else
    {
        nUsersOfHTTPAPI++;
        result = HTTPAPI_OK;
    }

    return result;
}